

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::gen_transform_feedbacks(NegativeTestContext *ctx)

{
  allocator<char> local_31;
  GLuint id;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&id,"GL_INVALID_VALUE is generated if n is negative.",&local_31);
  NegativeTestContext::beginSection(ctx,(string *)&id);
  std::__cxx11::string::~string((string *)&id);
  id = 0;
  glu::CallLogWrapper::glGenTransformFeedbacks(&ctx->super_CallLogWrapper,-1,&id);
  NegativeTestContext::expectError(ctx,0x501);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void gen_transform_feedbacks (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_VALUE is generated if n is negative.");
	GLuint id = 0;
	ctx.glGenTransformFeedbacks(-1, &id);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();
}